

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void SimpleLoggerMgr::flushWorker(void)

{
  bool bVar1;
  pthread_t __target_thread;
  SimpleLoggerMgr *pSVar2;
  __int_type _Var3;
  SimpleLoggerMgr *pSVar4;
  ostream *this;
  size_t sub_ms;
  SimpleLoggerMgr *mgr;
  SimpleLoggerMgr *this_00;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  SimpleLoggerMgr *in_stack_fffffffffffffff0;
  
  __target_thread = pthread_self();
  pthread_setname_np(__target_thread,"sl_flusher");
  pSVar2 = get();
  while( true ) {
    do {
      bVar1 = chkTermination((SimpleLoggerMgr *)0x188ffc);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return;
      }
      this_00 = (SimpleLoggerMgr *)0x1f4;
      sleepFlusher(in_stack_fffffffffffffff0,
                   CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      flushAllLoggers(in_stack_fffffffffffffff0);
      _Var3 = std::__atomic_base::operator_cast_to_unsigned_long
                        ((__atomic_base<unsigned_long> *)this_00);
    } while (_Var3 == 0);
    pSVar4 = (SimpleLoggerMgr *)
             std::__atomic_base::operator_cast_to_unsigned_long
                       ((__atomic_base<unsigned_long> *)this_00);
    if (pSVar4 <= this_00) break;
    in_stack_ffffffffffffffec = 5;
    LOCK();
    (pSVar2->abortTimer).super___atomic_base<unsigned_long>._M_i =
         (pSVar2->abortTimer).super___atomic_base<unsigned_long>._M_i - (long)this_00;
    UNLOCK();
    in_stack_fffffffffffffff0 = this_00;
  }
  this = std::operator<<((ostream *)&std::cerr,"STACK DUMP TIMEOUT, FORCE ABORT");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

void SimpleLoggerMgr::flushWorker() {
#ifdef __linux__
    pthread_setname_np(pthread_self(), "sl_flusher");
#endif
    SimpleLoggerMgr* mgr = SimpleLoggerMgr::get();
    while (!mgr->chkTermination()) {
        // Every 500ms.
        size_t sub_ms = 500;
        mgr->sleepFlusher(sub_ms);
        mgr->flushAllLoggers();
        if (mgr->abortTimer) {
            if (mgr->abortTimer > sub_ms) {
                mgr->abortTimer.fetch_sub(sub_ms);
            } else {
                std::cerr << "STACK DUMP TIMEOUT, FORCE ABORT" << std::endl;
                exit(-1);
            }
        }
    }
}